

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O0

void suidgid(char *user,uint ext)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  undefined1 local_110 [8];
  uidgid ugid;
  uint ext_local;
  char *user_local;
  
  ugid.gid[0x3c] = ext;
  unique0x100001bf = user;
  if (ext == 0) {
    uVar1 = uidgid_get((uidgid *)local_110,user);
    if (uVar1 == 0) {
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        fatal("unable to get password file entry");
      }
      fatalx("unknown account",stack0xfffffffffffffff0);
    }
  }
  else {
    uVar1 = uidgids_get((uidgid *)local_110,user);
    if (uVar1 == 0) {
      if (*stack0xfffffffffffffff0 == ':') {
        fatalx("invalid uid/gids",stack0xfffffffffffffff0 + 1);
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        fatal("unable to get password/group file entry");
      }
      fatalx("unknown user/group",stack0xfffffffffffffff0);
    }
  }
  iVar2 = setgroups((long)(int)ugid.gid[0x3b],(__gid_t *)(local_110 + 4));
  if (iVar2 == -1) {
    fatal("unable to setgroups");
  }
  iVar2 = setgid(local_110._4_4_);
  if (iVar2 == -1) {
    fatal("unable to setgid");
  }
  iVar2 = prot_uid(local_110._0_4_);
  if (iVar2 == -1) {
    fatal("unable to setuid");
  }
  return;
}

Assistant:

void suidgid(char *user, unsigned int ext) {
  struct uidgid ugid;

  if (ext) {
    if (! uidgids_get(&ugid, user)) {
      if (*user == ':') fatalx("invalid uid/gids", user +1);
      if (errno) fatal("unable to get password/group file entry");
      fatalx("unknown user/group", user);
    }
  }
  else
    if (! uidgid_get(&ugid, user)) {
      if (errno) fatal("unable to get password file entry");
      fatalx("unknown account", user);
    }
  if (setgroups(ugid.gids, ugid.gid) == -1) fatal("unable to setgroups");
  if (setgid(*ugid.gid) == -1) fatal("unable to setgid");
  if (prot_uid(ugid.uid) == -1) fatal("unable to setuid");
}